

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection_impl.hpp
# Opt level: O0

void __thiscall
websocketpp::connection<websocketpp::config::asio>::process_control_frame
          (connection<websocketpp::config::asio> *this,message_ptr *msg)

{
  bool bVar1;
  value vVar2;
  element_type *peVar3;
  element_type *peVar4;
  ostream *poVar5;
  element_type *peVar6;
  string *psVar7;
  element_type *peVar8;
  size_t in_RCX;
  size_t __n;
  connection<websocketpp::config::asio> *in_RDI;
  error_code eVar9;
  bool should_reply;
  stringstream s;
  error_code ec;
  value op;
  undefined6 in_stack_fffffffffffffb78;
  value in_stack_fffffffffffffb7e;
  connection<websocketpp::config::asio> *in_stack_fffffffffffffb80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb90;
  undefined4 in_stack_fffffffffffffb98;
  undefined4 in_stack_fffffffffffffb9c;
  function<bool_(std::weak_ptr<void>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  *in_stack_fffffffffffffba0;
  error_code *in_stack_fffffffffffffbc0;
  allocator *paVar10;
  string *in_stack_fffffffffffffbc8;
  error_code *in_stack_fffffffffffffbe0;
  undefined4 in_stack_fffffffffffffbe8;
  undefined4 in_stack_fffffffffffffbec;
  error_code local_3a8;
  string local_398 [32];
  int local_378;
  undefined4 uStack_374;
  error_category *local_370;
  string local_368 [39];
  allocator local_341;
  string local_340 [39];
  allocator local_319;
  string local_318 [32];
  int local_2f8;
  undefined4 uStack_2f4;
  error_category *local_2f0;
  string local_2e8 [39];
  allocator local_2c1;
  string local_2c0 [32];
  int local_2a0;
  undefined4 uStack_29c;
  error_category *local_298;
  string local_290 [24];
  error_code *in_stack_fffffffffffffd88;
  char *in_stack_fffffffffffffd90;
  string local_268 [4];
  level in_stack_fffffffffffffd9c;
  connection<websocketpp::config::asio> *in_stack_fffffffffffffda0;
  string local_248 [48];
  string local_218 [51];
  byte local_1e5;
  undefined4 local_1e4;
  string local_1e0 [48];
  stringstream local_1b0 [16];
  ostream local_1a0 [64];
  error_code *in_stack_fffffffffffffea0;
  string *in_stack_fffffffffffffea8;
  connection<websocketpp::config::asio> *in_stack_fffffffffffffeb0;
  error_code local_28;
  value local_14;
  
  peVar3 = std::
           __shared_ptr_access<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x2eb1bb);
  log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>::write
            (peVar3,0x400,"process_control_frame",in_RCX);
  peVar4 = std::
           __shared_ptr_access<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x2eb1dc);
  local_14 = message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>::
             get_opcode(peVar4);
  std::error_code::error_code((error_code *)in_stack_fffffffffffffb80);
  std::__cxx11::stringstream::stringstream(local_1b0);
  poVar5 = std::operator<<(local_1a0,"Control frame received with opcode ");
  std::ostream::operator<<(poVar5,local_14);
  peVar3 = std::
           __shared_ptr_access<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x2eb24d);
  std::__cxx11::stringstream::str();
  log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>::write
            (peVar3,4,local_1e0,in_RCX);
  std::__cxx11::string::~string(local_1e0);
  if (in_RDI->m_state == closed) {
    peVar6 = std::
             __shared_ptr_access<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::elevel>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::elevel>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x2eb2ba);
    log::basic<websocketpp::concurrency::basic,_websocketpp::log::elevel>::write
              (peVar6,8,"got frame in state closed",in_RCX);
    local_1e4 = 1;
  }
  else if ((local_14 == CLOSE) || (in_RDI->m_state == open)) {
    if (local_14 == PING) {
      local_1e5 = 1;
      bVar1 = std::function::operator_cast_to_bool
                        ((function<bool_(std::weak_ptr<void>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                          *)0x2eb39e);
      if (bVar1) {
        std::weak_ptr<void>::weak_ptr
                  ((weak_ptr<void> *)in_stack_fffffffffffffb80,
                   (weak_ptr<void> *)CONCAT26(in_stack_fffffffffffffb7e,in_stack_fffffffffffffb78));
        peVar4 = std::
                 __shared_ptr_access<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x2eb3e1);
        psVar7 = message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>::
                 get_payload_abi_cxx11_(peVar4);
        std::__cxx11::string::string(local_218,(string *)psVar7);
        local_1e5 = std::
                    function<bool_(std::weak_ptr<void>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                    ::operator()(in_stack_fffffffffffffba0,
                                 (weak_ptr<void> *)
                                 CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98),
                                 in_stack_fffffffffffffb90);
        std::__cxx11::string::~string(local_218);
        std::weak_ptr<void>::~weak_ptr((weak_ptr<void> *)0x2eb44b);
      }
      if ((local_1e5 & 1) != 0) {
        peVar4 = std::
                 __shared_ptr_access<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x2eb4ad);
        message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>::
        get_payload_abi_cxx11_(peVar4);
        pong(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
        bVar1 = std::error_code::operator_cast_to_bool(&local_28);
        if (bVar1) {
          log_err<std::error_code>
                    (in_stack_fffffffffffffda0,in_stack_fffffffffffffd9c,in_stack_fffffffffffffd90,
                     in_stack_fffffffffffffd88);
        }
      }
    }
    else if (local_14 == PONG) {
      bVar1 = std::function::operator_cast_to_bool
                        ((function<void_(std::weak_ptr<void>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                          *)0x2eb530);
      if (bVar1) {
        std::weak_ptr<void>::weak_ptr
                  ((weak_ptr<void> *)in_stack_fffffffffffffb80,
                   (weak_ptr<void> *)CONCAT26(in_stack_fffffffffffffb7e,in_stack_fffffffffffffb78));
        peVar4 = std::
                 __shared_ptr_access<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x2eb573);
        psVar7 = message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>::
                 get_payload_abi_cxx11_(peVar4);
        std::__cxx11::string::string(local_248,(string *)psVar7);
        std::
        function<void_(std::weak_ptr<void>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
        ::operator()((function<void_(std::weak_ptr<void>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                      *)in_stack_fffffffffffffba0,
                     (weak_ptr<void> *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98)
                     ,in_stack_fffffffffffffb90);
        std::__cxx11::string::~string(local_248);
        std::weak_ptr<void>::~weak_ptr((weak_ptr<void> *)0x2eb5c6);
      }
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&in_RDI->m_ping_timer);
      if (bVar1) {
        std::
        __shared_ptr_access<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x2eb63f);
        asio::
        basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>
        ::cancel((basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>
                  *)in_stack_fffffffffffffba0);
      }
    }
    else if (local_14 == CLOSE) {
      peVar8 = std::
               __shared_ptr_access<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x2eb672);
      log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>::write
                (peVar8,0x400,"got close frame",in_RCX);
      peVar4 = std::
               __shared_ptr_access<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x2eb695);
      message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>::
      get_payload_abi_cxx11_(peVar4);
      vVar2 = websocketpp::close::extract_code(in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0);
      __n = CONCAT62((int6)(in_RCX >> 0x10),vVar2);
      in_RDI->m_remote_close_code = vVar2;
      bVar1 = std::error_code::operator_cast_to_bool(&local_28);
      if (bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_268,"",(allocator *)&stack0xfffffffffffffd97);
        std::__cxx11::stringstream::str((string *)local_1b0);
        std::__cxx11::string::~string(local_268);
        std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffd97);
        poVar5 = std::operator<<(local_1a0,"Received invalid close code ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,in_RDI->m_remote_close_code);
        std::operator<<(poVar5," sending acknowledgement and closing");
        peVar6 = std::
                 __shared_ptr_access<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::elevel>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::elevel>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x2eb7b6);
        std::__cxx11::stringstream::str();
        log::basic<websocketpp::concurrency::basic,_websocketpp::log::elevel>::write
                  (peVar6,1,local_290,__n);
        std::__cxx11::string::~string(local_290);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_2c0,"Invalid close code",&local_2c1);
        eVar9 = send_close_ack(in_stack_fffffffffffffb80,in_stack_fffffffffffffb7e,
                               (string *)0x2eb845);
        local_298 = eVar9._M_cat;
        local_2a0 = eVar9._M_value;
        local_28._4_4_ = uStack_29c;
        local_28._M_value = local_2a0;
        local_28._M_cat = local_298;
        std::__cxx11::string::~string(local_2c0);
        std::allocator<char>::~allocator((allocator<char> *)&local_2c1);
        bVar1 = std::error_code::operator_cast_to_bool(&local_28);
        if (bVar1) {
          log_err<std::error_code>
                    (in_stack_fffffffffffffda0,in_stack_fffffffffffffd9c,in_stack_fffffffffffffd90,
                     in_stack_fffffffffffffd88);
        }
        local_1e4 = 1;
        goto LAB_002ebef3;
      }
      peVar4 = std::
               __shared_ptr_access<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x2eb9b5);
      message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>::
      get_payload_abi_cxx11_(peVar4);
      websocketpp::close::extract_reason
                ((string *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8),
                 in_stack_fffffffffffffbe0);
      std::__cxx11::string::operator=((string *)&in_RDI->m_remote_close_reason,local_2e8);
      std::__cxx11::string::~string(local_2e8);
      bVar1 = std::error_code::operator_cast_to_bool(&local_28);
      if (bVar1) {
        peVar6 = std::
                 __shared_ptr_access<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::elevel>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::elevel>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x2eba2a);
        log::basic<websocketpp::concurrency::basic,_websocketpp::log::elevel>::write
                  (peVar6,1,"Received invalid close reason. Sending acknowledgement and closing",__n
                  );
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_318,"Invalid close reason",&local_319);
        eVar9 = send_close_ack(in_stack_fffffffffffffb80,in_stack_fffffffffffffb7e,
                               (string *)0x2eba87);
        local_2f0 = eVar9._M_cat;
        local_2f8 = eVar9._M_value;
        local_28._4_4_ = uStack_2f4;
        local_28._M_value = local_2f8;
        local_28._M_cat = local_2f0;
        std::__cxx11::string::~string(local_318);
        std::allocator<char>::~allocator((allocator<char> *)&local_319);
        bVar1 = std::error_code::operator_cast_to_bool(&local_28);
        if (bVar1) {
          log_err<std::error_code>
                    (in_stack_fffffffffffffda0,in_stack_fffffffffffffd9c,in_stack_fffffffffffffd90,
                     in_stack_fffffffffffffd88);
        }
        local_1e4 = 1;
        goto LAB_002ebef3;
      }
      if (in_RDI->m_state == open) {
        paVar10 = &local_341;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_340,"",paVar10);
        std::__cxx11::stringstream::str((string *)local_1b0);
        std::__cxx11::string::~string(local_340);
        std::allocator<char>::~allocator((allocator<char> *)&local_341);
        poVar5 = std::operator<<(local_1a0,"Received close frame with code ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,in_RDI->m_remote_close_code);
        poVar5 = std::operator<<(poVar5," and reason ");
        std::operator<<(poVar5,(string *)&in_RDI->m_remote_close_reason);
        peVar3 = std::
                 __shared_ptr_access<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x2ebc6a);
        std::__cxx11::stringstream::str();
        log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>::write
                  (peVar3,0x400,local_368,__n);
        std::__cxx11::string::~string(local_368);
        std::__cxx11::string::string(local_398);
        eVar9 = send_close_ack(in_stack_fffffffffffffb80,in_stack_fffffffffffffb7e,
                               (string *)0x2ebcd2);
        local_370 = eVar9._M_cat;
        local_378 = eVar9._M_value;
        local_28._4_4_ = uStack_374;
        local_28._M_value = local_378;
        local_28._M_cat = local_370;
        std::__cxx11::string::~string(local_398);
        bVar1 = std::error_code::operator_cast_to_bool(&local_28);
        if (bVar1) {
          log_err<std::error_code>
                    (in_stack_fffffffffffffda0,in_stack_fffffffffffffd9c,in_stack_fffffffffffffd90,
                     in_stack_fffffffffffffd88);
        }
      }
      else if ((in_RDI->m_state == closing) && ((in_RDI->m_was_clean & 1U) == 0)) {
        peVar8 = std::
                 __shared_ptr_access<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x2ebe30);
        log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>::write
                  (peVar8,0x400,"Got acknowledgement of close",__n);
        in_RDI->m_was_clean = true;
        if ((in_RDI->m_is_server & 1U) != 0) {
          std::error_code::error_code(&local_3a8);
          terminate(in_RDI,(error_code *)peVar3);
        }
      }
      else {
        peVar6 = std::
                 __shared_ptr_access<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::elevel>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::elevel>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x2ebe9c);
        log::basic<websocketpp::concurrency::basic,_websocketpp::log::elevel>::write
                  (peVar6,1,"Got close frame in wrong state",__n);
      }
    }
    else {
      peVar6 = std::
               __shared_ptr_access<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::elevel>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::elevel>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x2ebecc);
      log::basic<websocketpp::concurrency::basic,_websocketpp::log::elevel>::write
                (peVar6,1,"Got control frame with invalid opcode",in_RCX);
    }
    local_1e4 = 0;
  }
  else {
    peVar6 = std::
             __shared_ptr_access<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::elevel>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::elevel>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x2eb34e);
    log::basic<websocketpp::concurrency::basic,_websocketpp::log::elevel>::write
              (peVar6,8,"got non-close frame in state closing",in_RCX);
    local_1e4 = 1;
  }
LAB_002ebef3:
  std::__cxx11::stringstream::~stringstream(local_1b0);
  return;
}

Assistant:

void connection<config>::process_control_frame(typename config::message_type::ptr msg)
{
    m_alog->write(log::alevel::devel,"process_control_frame");

    frame::opcode::value op = msg->get_opcode();
    lib::error_code ec;

    std::stringstream s;
    s << "Control frame received with opcode " << op;
    m_alog->write(log::alevel::control,s.str());

    if (m_state == session::state::closed) {
        m_elog->write(log::elevel::warn,"got frame in state closed");
        return;
    }
    if (op != frame::opcode::CLOSE && m_state != session::state::open) {
        m_elog->write(log::elevel::warn,"got non-close frame in state closing");
        return;
    }

    if (op == frame::opcode::PING) {
        bool should_reply = true;

        if (m_ping_handler) {
            should_reply = m_ping_handler(m_connection_hdl, msg->get_payload());
        }

        if (should_reply) {
            this->pong(msg->get_payload(),ec);
            if (ec) {
                log_err(log::elevel::devel,"Failed to send response pong",ec);
            }
        }
    } else if (op == frame::opcode::PONG) {
        if (m_pong_handler) {
            m_pong_handler(m_connection_hdl, msg->get_payload());
        }
        if (m_ping_timer) {
            m_ping_timer->cancel();
        }
    } else if (op == frame::opcode::CLOSE) {
        m_alog->write(log::alevel::devel,"got close frame");
        // record close code and reason somewhere

        m_remote_close_code = close::extract_code(msg->get_payload(),ec);
        if (ec) {
            s.str("");
            if (config::drop_on_protocol_error) {
                s << "Received invalid close code " << m_remote_close_code
                  << " dropping connection per config.";
                m_elog->write(log::elevel::devel,s.str());
                this->terminate(ec);
            } else {
                s << "Received invalid close code " << m_remote_close_code
                  << " sending acknowledgement and closing";
                m_elog->write(log::elevel::devel,s.str());
                ec = send_close_ack(close::status::protocol_error,
                    "Invalid close code");
                if (ec) {
                    log_err(log::elevel::devel,"send_close_ack",ec);
                }
            }
            return;
        }

        m_remote_close_reason = close::extract_reason(msg->get_payload(),ec);
        if (ec) {
            if (config::drop_on_protocol_error) {
                m_elog->write(log::elevel::devel,
                    "Received invalid close reason. Dropping connection per config");
                this->terminate(ec);
            } else {
                m_elog->write(log::elevel::devel,
                    "Received invalid close reason. Sending acknowledgement and closing");
                ec = send_close_ack(close::status::protocol_error,
                    "Invalid close reason");
                if (ec) {
                    log_err(log::elevel::devel,"send_close_ack",ec);
                }
            }
            return;
        }

        if (m_state == session::state::open) {
            s.str("");
            s << "Received close frame with code " << m_remote_close_code
              << " and reason " << m_remote_close_reason;
            m_alog->write(log::alevel::devel,s.str());

            ec = send_close_ack();
            if (ec) {
                log_err(log::elevel::devel,"send_close_ack",ec);
            }
        } else if (m_state == session::state::closing && !m_was_clean) {
            // ack of our close
            m_alog->write(log::alevel::devel, "Got acknowledgement of close");

            m_was_clean = true;

            // If we are a server terminate the connection now. Clients should
            // leave the connection open to give the server an opportunity to
            // initiate the TCP close. The client's timer will handle closing
            // its side of the connection if the server misbehaves.
            //
            // TODO: different behavior if the underlying transport doesn't
            // support timers?
            if (m_is_server) {
                terminate(lib::error_code());
            }
        } else {
            // spurious, ignore
            m_elog->write(log::elevel::devel, "Got close frame in wrong state");
        }
    } else {
        // got an invalid control opcode
        m_elog->write(log::elevel::devel, "Got control frame with invalid opcode");
        // initiate protocol error shutdown
    }
}